

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void xLearn::AUCMetric::auc_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,Info *info,size_t start_idx,size_t end_idx)

{
  pointer puVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  uint uVar5;
  Info *pIVar6;
  ostream *poVar7;
  size_t i;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (start_idx <= end_idx) {
    for (; end_idx != start_idx; start_idx = start_idx + 1) {
      auVar8 = ZEXT416((uint)((pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start[start_idx] * -1.442695));
      uVar3 = vcmpss_avx512f(auVar8,ZEXT816(0) << 0x40,1);
      auVar8 = vmaxss_avx(SUB6416(ZEXT464(0xc2fc0000),0),auVar8);
      fVar2 = auVar8._0_4_;
      auVar9._0_4_ = (int)fVar2;
      auVar9._4_4_ = (int)auVar8._4_4_;
      auVar9._8_4_ = (int)auVar8._8_4_;
      auVar9._12_4_ = (int)auVar8._12_4_;
      auVar8 = vcvtdq2ps_avx(auVar9);
      fVar4 = (float)((uint)((byte)uVar3 & 1) * 0x3f800000) + (fVar2 - auVar8._0_4_);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 + 121.274055 + 27.728024 / (4.8425255 - fVar4)))
                               ,ZEXT416((uint)fVar4),SUB6416(ZEXT464(0xbfbebc8d),0));
      fVar4 = (float)vcvttss2usi_avx512f(ZEXT416((uint)(auVar8._0_4_ * 8388608.0)));
      uVar5 = vcvttss2usi_avx512f(ZEXT416((uint)((1.0 / (fVar4 + 1.0)) * 1e+06)));
      pIVar6 = (Info *)&info->negative_vec_;
      if (0.0 < (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start[start_idx]) {
        pIVar6 = info;
      }
      puVar1 = (pIVar6->positive_vec_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar5 % 1000000;
      *puVar1 = *puVar1 + 1;
    }
    return;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             &local_55);
  std::__cxx11::string::string((string *)&local_50,"auc_accum_thread",&local_56);
  poVar7 = Logger::Start(ERR,&local_30,499,&local_50);
  poVar7 = std::operator<<(poVar7,"CHECK_GE failed ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
                          );
  poVar7 = std::operator<<(poVar7,":");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,499);
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"end_idx");
  poVar7 = std::operator<<(poVar7," = ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"start_idx");
  poVar7 = std::operator<<(poVar7," = ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

static void auc_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               Info* info,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      real_t sigmoid_score = fastsigmoid((*pred)[i]);
      index_t bkt_id = index_t(sigmoid_score * kMaxBucketSize) 
                       % kMaxBucketSize;
      CHECK_LT(bkt_id, kMaxBucketSize);
      if (r_label > 0) {
        info->positive_vec_[bkt_id] += 1;
      } else {
        info->negative_vec_[bkt_id] += 1;
      }
    }
  }